

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

quat quat_create(float x,float y,float z,float w)

{
  quat qVar1;
  float w_local;
  float z_local;
  float y_local;
  float x_local;
  quat q;
  
  qVar1.y = y;
  qVar1.x = x;
  qVar1.z = z;
  qVar1.w = w;
  return qVar1;
}

Assistant:

quat quat_create(float x, float y, float z, float w) {
    quat q;
    q.x = x;
    q.y = y;
    q.z = z;
    q.w = w;
    return q;
}